

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O0

uint32_t Hacl_Bignum4096_32_add(uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t *res_i;
  uint32_t t2;
  uint32_t t12;
  uint32_t *res_i2;
  uint32_t t22;
  uint32_t t11;
  uint32_t *res_i1;
  uint32_t t21;
  uint32_t t10;
  uint32_t *res_i0;
  uint32_t t20;
  uint32_t t1;
  uint32_t i;
  uint32_t c;
  uint32_t *res_local;
  uint32_t *b_local;
  uint32_t *a_local;
  
  t1 = 0;
  for (t20 = 0; t20 < 0x20; t20 = t20 + 1) {
    uVar1 = a[t20 << 2];
    uVar2 = b[t20 << 2];
    uVar5 = (uint)((char)t1 != '\0');
    uVar6 = uVar1 + uVar2;
    res[t20 << 2] = uVar6 + uVar5;
    uVar3 = a[t20 * 4 + 1];
    uVar4 = b[t20 * 4 + 1];
    uVar5 = (uint)(CARRY4(uVar1,uVar2) || CARRY4(uVar6,uVar5));
    uVar6 = uVar3 + uVar4;
    res[(ulong)(t20 << 2) + 1] = uVar6 + uVar5;
    uVar1 = a[t20 * 4 + 2];
    uVar2 = b[t20 * 4 + 2];
    uVar5 = (uint)(CARRY4(uVar3,uVar4) || CARRY4(uVar6,uVar5));
    uVar6 = uVar1 + uVar2;
    res[(ulong)(t20 << 2) + 2] = uVar6 + uVar5;
    uVar3 = a[t20 * 4 + 3];
    uVar4 = b[t20 * 4 + 3];
    uVar1 = (uint)(CARRY4(uVar1,uVar2) || CARRY4(uVar6,uVar5));
    uVar2 = uVar3 + uVar4;
    res[(ulong)(t20 << 2) + 3] = uVar2 + uVar1;
    t1 = (uint32_t)(CARRY4(uVar3,uVar4) || CARRY4(uVar2,uVar1));
  }
  return t1;
}

Assistant:

uint32_t Hacl_Bignum4096_32_add(uint32_t *a, uint32_t *b, uint32_t *res)
{
  uint32_t c = 0U;
  for (uint32_t i = 0U; i < 32U; i++)
  {
    uint32_t t1 = a[4U * i];
    uint32_t t20 = b[4U * i];
    uint32_t *res_i0 = res + 4U * i;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t1, t20, res_i0);
    uint32_t t10 = a[4U * i + 1U];
    uint32_t t21 = b[4U * i + 1U];
    uint32_t *res_i1 = res + 4U * i + 1U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t10, t21, res_i1);
    uint32_t t11 = a[4U * i + 2U];
    uint32_t t22 = b[4U * i + 2U];
    uint32_t *res_i2 = res + 4U * i + 2U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t11, t22, res_i2);
    uint32_t t12 = a[4U * i + 3U];
    uint32_t t2 = b[4U * i + 3U];
    uint32_t *res_i = res + 4U * i + 3U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t12, t2, res_i);
  }
  return c;
}